

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode JsTTDNotifyLongLivedReferenceAdd(JsValueRef value)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  ThreadContext *pTVar4;
  RecyclableObject *newRoot;
  undefined4 *puVar5;
  JsErrorCode JVar6;
  AutoNestedHandledExceptionType local_58 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  undefined1 auStack_38 [8];
  TTDRecorder _actionEntryPopper;
  
  auStack_38 = (undefined1  [8])0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_58,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  pTVar4 = ThreadContext::GetContextForCurrentThread();
  if (pTVar4 == (ThreadContext *)0x0) {
    JVar6 = JsErrorNoCurrentContext;
  }
  else {
    bVar3 = Js::VarIs<Js::RecyclableObject>(value);
    JVar6 = JsNoError;
    if (bVar3) {
      newRoot = Js::VarTo<Js::RecyclableObject>(value);
      pSVar1 = (((((newRoot->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      JVar6 = JsNoError;
      if (pSVar1->TTDRecordModeEnabled == true) {
        if (pSVar1->TTDShouldPerformRecordAction == true) {
          TTD::EventLog::RecordJsRTAddWeakRootRef
                    (pTVar4->TTDLog,(TTDJsRTActionResultAutoRecorder *)auStack_38,value);
        }
        TTD::ThreadContextTTD::AddRootRef_Record(pTVar4->TTDContext,(TTD_LOG_PTR_ID)newRoot,newRoot)
        ;
      }
    }
  }
  if (pTVar4 == (ThreadContext *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                       ,0x89,
                       "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                       ,
                       "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_58);
  if (auStack_38 != (undefined1  [8])0x0) {
    if (*(int32 *)((long)auStack_38 + 4) != -1) {
      TTDAbort_unrecoverable_error("Hmm this got changed somewhere???");
    }
    *(JsErrorCode *)((long)auStack_38 + 4) = JVar6;
  }
  return JVar6;
}

Assistant:

CHAKRA_API JsTTDNotifyLongLivedReferenceAdd(_In_ JsValueRef value)
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else
    return GlobalAPIWrapper([&](TTDRecorder& _actionEntryPopper) -> JsErrorCode
    {
        ThreadContext* threadContext = ThreadContext::GetContextForCurrentThread();
        if(threadContext == nullptr)
        {
            return JsErrorNoCurrentContext;
        }

        if (Js::VarIs<Js::RecyclableObject>(value))
        {
            Js::RecyclableObject* obj = Js::VarTo<Js::RecyclableObject>(value);
            if (obj->GetScriptContext()->IsTTDRecordModeEnabled())
            {
                if (obj->GetScriptContext()->ShouldPerformRecordAction())
                {
                    threadContext->TTDLog->RecordJsRTAddWeakRootRef(_actionEntryPopper, (Js::Var)value);
                }

                threadContext->TTDContext->AddRootRef_Record(TTD_CONVERT_OBJ_TO_LOG_PTR_ID(obj), obj);
            }
        }

        return JsNoError;
    });
#endif
}